

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O2

int lws_urldecode_spa_cb(lws_spa *spa,char *name,char **buf,int len,int final)

{
  int *piVar1;
  lws_spa_fileupload_cb p_Var2;
  lwsac **head;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char **ppcVar7;
  long lVar8;
  
  if ((final == 3) || (spa->s->content_disp_filename[0] != '\0')) {
    p_Var2 = (spa->i).opt_cb;
    if (p_Var2 != (lws_spa_fileupload_cb)0x0) {
      if (buf == (char **)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = *buf;
      }
      iVar3 = (*p_Var2)((spa->i).opt_data,name,spa->s->content_disp_filename,pcVar6,len,final);
      if (iVar3 < 0) {
        return -1;
      }
    }
  }
  else {
    ppcVar7 = (spa->i).param_names;
    iVar3 = (spa->i).count_params;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (lVar8 = 0; iVar3 != (int)lVar8; lVar8 = lVar8 + 1) {
      iVar4 = strcmp(*ppcVar7,name);
      if (iVar4 == 0) {
        if (len == 0) {
          return 0;
        }
        head = (spa->i).ac;
        if (head == (lwsac **)0x0) {
          pcVar6 = *buf;
          if (spa->params[lVar8] == (char *)0x0) {
            spa->params[lVar8] = pcVar6;
          }
          pcVar6 = pcVar6 + len;
          if (spa->end <= pcVar6) {
            _lws_log(8,"%s: exceeded storage\n","lws_urldecode_spa_cb");
            return -1;
          }
          *buf = pcVar6 + 1;
          *pcVar6 = '\0';
          piVar1 = &spa->s->out_len;
          *piVar1 = *piVar1 + ~len;
        }
        else {
          pcVar6 = (char *)lwsac_use(head,(ulong)(len + 1),(spa->i).ac_chunk_size);
          spa->params[lVar8] = pcVar6;
          if (spa->params[lVar8] == (char *)0x0) {
            return -1;
          }
          memcpy(spa->params[lVar8],*buf,(ulong)(uint)len);
          spa->params[lVar8][len] = '\0';
        }
        spa->param_length[lVar8] = spa->param_length[lVar8] + len;
        return 0;
      }
      sVar5 = (spa->i).param_names_stride;
      if (sVar5 == 0) {
        sVar5 = 8;
      }
      ppcVar7 = (char **)((long)ppcVar7 + sVar5);
    }
  }
  return 0;
}

Assistant:

static int
lws_urldecode_spa_cb(struct lws_spa *spa, const char *name, char **buf, int len,
		     int final)
{
	int n;

	if (final == LWS_UFS_CLOSE || spa->s->content_disp_filename[0]) {
		if (spa->i.opt_cb) {
			n = spa->i.opt_cb(spa->i.opt_data, name,
					spa->s->content_disp_filename,
					buf ? *buf : NULL, len, (enum lws_spa_fileupload_states)final);

			if (n < 0)
				return -1;
		}
		return 0;
	}
	n = lws_urldecode_spa_lookup(spa, name);
	if (n == -1 || !len) /* unrecognized */
		return 0;

	if (!spa->i.ac) {
		if (!spa->params[n])
			spa->params[n] = *buf;

		if ((*buf) + len >= spa->end) {
			lwsl_info("%s: exceeded storage\n", __func__);
			return -1;
		}

		/* move it on inside storage */
		(*buf) += len;
		*((*buf)++) = '\0';

		spa->s->out_len -= len + 1;
	} else {
		spa->params[n] = lwsac_use(spa->i.ac, (unsigned int)len + 1,
					   spa->i.ac_chunk_size);
		if (!spa->params[n])
			return -1;

		memcpy(spa->params[n], *buf, (unsigned int)len);
		spa->params[n][len] = '\0';
	}

	spa->param_length[n] += len;

	return 0;
}